

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O3

uint RDL_count_bonds(char *bitset,uint nofBonds)

{
  uint uVar1;
  ulong uVar2;
  
  if (nofBonds != 0) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uVar1 + 1) - (uint)(bitset[uVar2] == '\0');
      uVar2 = uVar2 + 1;
    } while (nofBonds != uVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned RDL_count_bonds(const char* bitset, unsigned nofBonds)
{
  unsigned count;
  unsigned idx;

  for (idx = 0, count = 0; idx < nofBonds; ++idx) {
    if (bitset[idx]) {
      ++count;
    }
  }

  return count;
}